

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallTargetGenerator::AddRanlibRule
          (cmInstallTargetGenerator *this,ostream *os,Indent *indent,string *toDestDirPath)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  ostream *poVar5;
  int iVar6;
  string ranlib;
  allocator local_71;
  string local_70;
  string local_50;
  
  TVar3 = cmGeneratorTarget::GetType(this->Target);
  if (TVar3 == STATIC_LIBRARY) {
    pcVar1 = this->Target->Target->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"APPLE","");
    bVar2 = cmMakefile::IsOn(pcVar1,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      pcVar1 = this->Target->Target->Makefile;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"CMAKE_RANLIB","");
      pcVar4 = cmMakefile::GetRequiredDefinition(pcVar1,&local_50);
      std::__cxx11::string::string((string *)&local_70,pcVar4,&local_71);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_70._M_string_length != 0) {
        if (0 < indent->Level) {
          iVar6 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            iVar6 = iVar6 + 1;
          } while (iVar6 < indent->Level);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" \"",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(toDestDirPath->_M_dataplus)._M_p,toDestDirPath->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void
cmInstallTargetGenerator::AddRanlibRule(std::ostream& os,
                                        Indent const& indent,
                                        const std::string& toDestDirPath)
{
  // Static libraries need ranlib on this platform.
  if(this->Target->GetType() != cmState::STATIC_LIBRARY)
    {
    return;
    }

  // Perform post-installation processing on the file depending
  // on its type.
  if(!this->Target->Target->GetMakefile()->IsOn("APPLE"))
    {
    return;
    }

  std::string ranlib =
    this->Target->Target->GetMakefile()->GetRequiredDefinition("CMAKE_RANLIB");
  if(ranlib.empty())
    {
    return;
    }

  os << indent << "execute_process(COMMAND \""
     << ranlib << "\" \"" << toDestDirPath << "\")\n";
}